

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmrig.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Id IVar1;
  App app;
  Id entry;
  Process process;
  Process *in_stack_ffffffffffffff68;
  Id in_stack_ffffffffffffff74;
  Process *process_00;
  undefined4 in_stack_ffffffffffffff80;
  App *in_stack_ffffffffffffff88;
  App *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  Process *in_stack_ffffffffffffffa0;
  Process local_38;
  int local_4;
  
  local_4 = 0;
  process_00 = &local_38;
  xmrig::Process::Process
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(char **)in_stack_ffffffffffffff90)
  ;
  IVar1 = xmrig::Entry::get(in_stack_ffffffffffffff68);
  if (IVar1 == Default) {
    xmrig::App::App(in_stack_ffffffffffffff90,(Process *)in_stack_ffffffffffffff88);
    local_4 = xmrig::App::exec(in_stack_ffffffffffffff88);
    xmrig::App::~App((App *)CONCAT44(IVar1,in_stack_ffffffffffffff80));
  }
  else {
    local_4 = xmrig::Entry::exec(process_00,in_stack_ffffffffffffff74);
  }
  xmrig::Process::~Process((Process *)0x23d68b);
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
    using namespace xmrig;

    Process process(argc, argv);
    const Entry::Id entry = Entry::get(process);
    if (entry) {
        return Entry::exec(process, entry);
    }

    App app(&process);

    return app.exec();
}